

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

jx9_int64 UnixVfs_FileSize(char *zPath)

{
  int iVar1;
  stat st;
  stat sStack_98;
  
  iVar1 = stat(zPath,&sStack_98);
  return -(ulong)(iVar1 != 0) | sStack_98.st_size;
}

Assistant:

static jx9_int64 UnixVfs_FileSize(const char *zPath)
{
	struct stat st;
	int rc;
	rc = stat(zPath, &st);
	if( rc != 0 ){ 
	 return -1;
	}
	return (jx9_int64)st.st_size;
}